

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark_relax.c
# Opt level: O0

int mark_relax(int n,int *relax_end,int *relax_fsupc,int_t *xa_begin,int_t *xa_end,int_t *asub,
              int *marker)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_4c;
  int local_48;
  int_t k;
  int_t j;
  int_t i;
  int kcol;
  int jcol;
  int_t *asub_local;
  int_t *xa_end_local;
  int_t *xa_begin_local;
  int *relax_fsupc_local;
  int *relax_end_local;
  int n_local;
  
  k = 0;
  while( true ) {
    bVar3 = false;
    if (k < n) {
      bVar3 = relax_fsupc[k] != -1;
    }
    if (!bVar3) break;
    iVar1 = relax_fsupc[k];
    iVar2 = relax_end[iVar1];
    for (local_48 = iVar1; local_48 <= iVar2; local_48 = local_48 + 1) {
      for (local_4c = xa_begin[local_48]; local_4c < xa_end[local_48]; local_4c = local_4c + 1) {
        marker[asub[local_4c]] = iVar1;
      }
    }
    k = k + 1;
  }
  return k;
}

Assistant:

int mark_relax(
	int n,		    /* order of the matrix A */
	const int *relax_end,     /* last column in a relaxed supernode.
			     * if j-th column starts a relaxed supernode,
			     * relax_end[j] represents the last column of
			     * this supernode. */
	const int *relax_fsupc,   /* first column in a relaxed supernode.
			     * relax_fsupc[j] represents the first column of
			     * j-th supernode. */
	const int_t *xa_begin,    /* Astore->colbeg */
	const int_t *xa_end,	    /* Astore->colend */
	const int_t *asub,	    /* row index of A */
	int   *marker	    /* marker[j] is the maximum column index if j-th
			     * row belongs to a relaxed supernode. */ )
{
    register int jcol, kcol;
    register int_t i, j;
    int_t k;

    for (i = 0; i < n && relax_fsupc[i] != SLU_EMPTY; i++)
    {
	jcol = relax_fsupc[i];	/* first column */
	kcol = relax_end[jcol]; /* last column */
	for (j = jcol; j <= kcol; j++)
	    for (k = xa_begin[j]; k < xa_end[j]; k++)
		marker[asub[k]] = jcol;
    }
    return i;
}